

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

void y4m_42xmpeg2_42xjpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  uchar *puVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long local_40;
  
  uVar1 = 2;
  if (_c_w < 2) {
    uVar1 = _c_w;
  }
  lVar5 = (long)_c_w;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = 0;
  }
  local_40 = 0;
  if (_c_h < 1) {
    _c_h = 0;
  }
  pbVar7 = _src;
  puVar8 = _dst;
  for (iVar4 = 0; iVar4 != _c_h; iVar4 = iVar4 + 1) {
    uVar11 = 0;
    while (iVar9 = (int)(lVar5 + -1), lVar12 = local_40, uVar13 = uVar2, uVar2 != uVar11) {
      iVar3 = (int)(uVar11 + 1);
      iVar10 = iVar9;
      if (iVar3 < iVar9) {
        iVar10 = iVar3;
      }
      iVar3 = (int)uVar11 + 2;
      if (iVar9 <= iVar3) {
        iVar3 = iVar9;
      }
      iVar6 = (int)uVar11 + 3;
      if (iVar9 <= iVar6) {
        iVar6 = iVar9;
      }
      iVar9 = (int)((uint)pbVar7[uVar11] * 0x72 + (uint)*pbVar7 * -0xd + (uint)pbVar7[iVar10] * 0x23
                    + (uint)pbVar7[iVar3] * -9 + (uint)pbVar7[iVar6] + 0x40) >> 7;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      puVar8[uVar11] = (uchar)iVar9;
      uVar11 = uVar11 + 1;
    }
    for (; (long)uVar13 < (long)(_c_w + -3); uVar13 = uVar13 + 1) {
      iVar10 = (int)((uint)pbVar7[uVar13 - 1] * -0x11 + (uint)pbVar7[uVar13 - 2] * 4 +
                     (uint)pbVar7[uVar13 + 1] * 0x23 + (uint)pbVar7[uVar13] * 0x72 +
                     (uint)pbVar7[uVar13 + 2] * -9 + (uint)pbVar7[uVar13 + 3] + 0x40) >> 7;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      puVar8[uVar13] = (uchar)iVar10;
      lVar12 = lVar12 + 1;
    }
    while ((long)uVar13 < lVar5) {
      iVar3 = (int)(uVar13 + 1);
      iVar10 = iVar9;
      if (iVar3 < iVar9) {
        iVar10 = iVar3;
      }
      iVar3 = (int)uVar13 + 2;
      if (iVar9 <= iVar3) {
        iVar3 = iVar9;
      }
      iVar10 = (int)((uint)pbVar7[lVar5 + -1] +
                     (uint)_src[lVar12 + (uVar2 - 1)] * -0x11 + (uint)_src[lVar12 + (uVar2 - 2)] * 4
                     + (uint)_src[lVar12 + uVar2] * 0x72 + (uint)pbVar7[iVar10] * 0x23 +
                     (uint)pbVar7[iVar3] * -9 + 0x40) >> 7;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      _dst[lVar12 + uVar2] = (uchar)iVar10;
      lVar12 = lVar12 + 1;
      uVar13 = uVar13 + 1;
    }
    puVar8 = puVar8 + lVar5;
    pbVar7 = pbVar7 + lVar5;
    local_40 = local_40 + lVar5;
  }
  return;
}

Assistant:

static void y4m_42xmpeg2_42xjpeg_helper(unsigned char *_dst,
                                        const unsigned char *_src, int _c_w,
                                        int _c_h) {
  int y;
  int x;
  for (y = 0; y < _c_h; y++) {
    /*Filter: [4 -17 114 35 -9 1]/128, derived from a 6-tap Lanczos
       window.*/
    for (x = 0; x < OC_MINI(_c_w, 2); x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[0] - 17 * _src[OC_MAXI(x - 1, 0)] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[OC_MINI(x + 3, _c_w - 1)] +
           64) >>
              7,
          255);
    }
    for (; x < _c_w - 3; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[x + 1] - 9 * _src[x + 2] + _src[x + 3] + 64) >>
              7,
          255);
    }
    for (; x < _c_w; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[_c_w - 1] + 64) >>
              7,
          255);
    }
    _dst += _c_w;
    _src += _c_w;
  }
}